

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

int __thiscall ncnn::ParamDict::load_param(ParamDict *this,DataReader *dr)

{
  bool bVar1;
  int iVar2;
  float *pfVar3;
  undefined4 uVar4;
  long *in_RSI;
  char *in_RDI;
  float fVar5;
  bool is_float_1;
  int nscan_1;
  char vstr_1 [16];
  int *ptr_1;
  float *ptr;
  bool is_float;
  char vstr [16];
  int j;
  int nscan;
  int len;
  bool is_array;
  int id;
  Allocator *in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff9c;
  Mat *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffb0;
  byte in_stack_ffffffffffffffb7;
  undefined1 local_48 [28];
  int local_2c;
  int local_28;
  int local_24;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint uVar6;
  
  clear((ParamDict *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  uVar6 = 0;
  while( true ) {
    iVar2 = (**(code **)(*in_RSI + 0x10))(in_RSI,"%d=",&stack0xffffffffffffffe4);
    if (iVar2 != 1) {
      return 0;
    }
    bVar1 = (int)uVar6 < -0x5b03;
    if (bVar1) {
      uVar6 = 0xffffa4fc - uVar6;
    }
    if (0x1f < (int)uVar6) break;
    if (bVar1) {
      local_24 = 0;
      local_28 = (**(code **)(*in_RSI + 0x10))(in_RSI,"%d",&local_24);
      if (local_28 != 1) {
        fprintf(_stderr,"ParamDict read array length failed");
        fprintf(_stderr,"\n");
        return -1;
      }
      ncnn::Mat::create(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                        in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      for (local_2c = 0; local_2c < local_24; local_2c = local_2c + 1) {
        local_28 = (**(code **)(*in_RSI + 0x10))(in_RSI,",%15[^,\n ]",local_48);
        if (local_28 != 1) {
          fprintf(_stderr,"ParamDict read array element failed");
          fprintf(_stderr,"\n");
          return -1;
        }
        in_stack_ffffffffffffffb7 = vstr_is_float(in_RDI);
        if ((bool)in_stack_ffffffffffffffb7) {
          pfVar3 = ncnn::Mat::operator_cast_to_float_
                             ((Mat *)(*(long *)(in_RDI + 8) + (long)(int)uVar6 * 0x50 + 8));
          fVar5 = vstr_to_float((char *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0
                                                ));
          pfVar3[local_2c] = fVar5;
        }
        else {
          in_stack_ffffffffffffffa0 =
               (Mat *)ncnn::Mat::operator_cast_to_int_
                                ((Mat *)(*(long *)(in_RDI + 8) + (long)(int)uVar6 * 0x50 + 8));
          local_28 = __isoc99_sscanf(local_48,"%d",
                                     (int *)((long)&in_stack_ffffffffffffffa0->data +
                                            (long)local_2c * 4));
          if (local_28 != 1) {
            fprintf(_stderr,"ParamDict parse array element failed");
            fprintf(_stderr,"\n");
            return -1;
          }
          local_28 = 1;
        }
        uVar4 = 5;
        if ((in_stack_ffffffffffffffb7 & 1) != 0) {
          uVar4 = 6;
        }
        *(undefined4 *)(*(long *)(in_RDI + 8) + (long)(int)uVar6 * 0x50) = uVar4;
      }
    }
    else {
      iVar2 = (**(code **)(*in_RSI + 0x10))(in_RSI,"%15s",&stack0xffffffffffffff88);
      if (iVar2 != 1) {
        fprintf(_stderr,"ParamDict read value failed");
        fprintf(_stderr,"\n");
        return -1;
      }
      bVar1 = vstr_is_float(in_RDI);
      if (bVar1) {
        fVar5 = vstr_to_float((char *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0))
        ;
        *(float *)(*(long *)(in_RDI + 8) + (long)(int)uVar6 * 0x50 + 4) = fVar5;
      }
      else {
        iVar2 = __isoc99_sscanf(&stack0xffffffffffffff88,"%d",
                                *(long *)(in_RDI + 8) + (long)(int)uVar6 * 0x50 + 4);
        if (iVar2 != 1) {
          fprintf(_stderr,"ParamDict parse value failed");
          fprintf(_stderr,"\n");
          return -1;
        }
      }
      uVar4 = 2;
      if (bVar1) {
        uVar4 = 3;
      }
      *(undefined4 *)(*(long *)(in_RDI + 8) + (long)(int)uVar6 * 0x50) = uVar4;
    }
  }
  fprintf(_stderr,"id < NCNN_MAX_PARAM_COUNT failed (id=%d, NCNN_MAX_PARAM_COUNT=%d)",(ulong)uVar6,
          0x20);
  fprintf(_stderr,"\n");
  return -1;
}

Assistant:

int ParamDict::load_param(const DataReader& dr)
{
    clear();

    //     0=100 1=1.250000 -23303=5,0.1,0.2,0.4,0.8,1.0

    // parse each key=value pair
    int id = 0;
    while (dr.scan("%d=", &id) == 1)
    {
        bool is_array = id <= -23300;
        if (is_array)
        {
            id = -id - 23300;
        }

        if (id >= NCNN_MAX_PARAM_COUNT)
        {
            NCNN_LOGE("id < NCNN_MAX_PARAM_COUNT failed (id=%d, NCNN_MAX_PARAM_COUNT=%d)", id, NCNN_MAX_PARAM_COUNT);
            return -1;
        }

        if (is_array)
        {
            int len = 0;
            int nscan = dr.scan("%d", &len);
            if (nscan != 1)
            {
                NCNN_LOGE("ParamDict read array length failed");
                return -1;
            }

            d->params[id].v.create(len);

            for (int j = 0; j < len; j++)
            {
                char vstr[16];
                nscan = dr.scan(",%15[^,\n ]", vstr);
                if (nscan != 1)
                {
                    NCNN_LOGE("ParamDict read array element failed");
                    return -1;
                }

                bool is_float = vstr_is_float(vstr);

                if (is_float)
                {
                    float* ptr = d->params[id].v;
                    ptr[j] = vstr_to_float(vstr);
                }
                else
                {
                    int* ptr = d->params[id].v;
                    nscan = sscanf(vstr, "%d", &ptr[j]);
                    if (nscan != 1)
                    {
                        NCNN_LOGE("ParamDict parse array element failed");
                        return -1;
                    }
                }

                d->params[id].type = is_float ? 6 : 5;
            }
        }
        else
        {
            char vstr[16];
            int nscan = dr.scan("%15s", vstr);
            if (nscan != 1)
            {
                NCNN_LOGE("ParamDict read value failed");
                return -1;
            }

            bool is_float = vstr_is_float(vstr);

            if (is_float)
            {
                d->params[id].f = vstr_to_float(vstr);
            }
            else
            {
                nscan = sscanf(vstr, "%d", &d->params[id].i);
                if (nscan != 1)
                {
                    NCNN_LOGE("ParamDict parse value failed");
                    return -1;
                }
            }

            d->params[id].type = is_float ? 3 : 2;
        }
    }

    return 0;
}